

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O0

int zero_overhead_test(int K,int nTest,float loss)

{
  void *__ptr;
  float nESIs;
  uint32_t *ESIs;
  ulong uVar1;
  ulong uVar2;
  undefined1 auStack_58 [12];
  int local_4c;
  uint32_t *local_48;
  int local_40;
  int local_3c;
  void *pvStack_38;
  int err;
  RqInterProgram *program;
  unsigned_long __vla_expr0;
  uint local_20;
  uint local_1c;
  int i;
  int nFail;
  float loss_local;
  int nTest_local;
  int K_local;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  loss_local = (float)K;
  nFail = nTest;
  i = (int)loss;
  local_1c = 0;
  local_20 = 0;
  do {
    nESIs = loss_local;
    if (nFail <= (int)local_20) {
      return local_1c;
    }
    ESIs = (uint32_t *)
           (__vla_expr0 + -((long)(ulong)(uint)loss_local * 4 + 0xfU & 0xfffffffffffffff0));
    local_48 = ESIs;
    program = (RqInterProgram *)(ulong)(uint)loss_local;
    if (((float)i != 1.0) || (NAN((float)i))) {
      ESIs[-2] = 0x101547;
      ESIs[-1] = 0;
      get_esis_after_loss(ESIs[7],*(uint32_t **)(ESIs + 4),(float)ESIs[3]);
    }
    else {
      ESIs[-2] = 0x101534;
      ESIs[-1] = 0;
      get_random_esis((int)nESIs,ESIs);
    }
    pvStack_38 = (void *)0x0;
    ESIs[-2] = 0x101561;
    ESIs[-1] = 0;
    local_3c = getProgram(ESIs[0x12],ESIs[0x11],*(uint32_t **)(ESIs + 0xe),
                          *(RqInterProgram ***)(ESIs + 0xc));
    local_4c = local_3c;
    if (local_3c == -4) {
      local_1c = local_1c + 1;
LAB_00101597:
      if ((int)local_20 % 1000 == 0) {
        uVar2 = (ulong)local_20;
        uVar1 = (ulong)local_1c;
        ESIs[-2] = 0x1015bb;
        ESIs[-1] = 0;
        printf("   Completed test %d, nFail=%d\n",uVar2,uVar1);
        ESIs[-2] = 0x1015ca;
        ESIs[-1] = 0;
        fflush(_stdout);
      }
      __ptr = pvStack_38;
      ESIs[-2] = 0x1015d3;
      ESIs[-1] = 0;
      free(__ptr);
      local_40 = 0;
    }
    else {
      if (local_3c == 0) goto LAB_00101597;
      nTest_local = -1;
      local_40 = 1;
    }
    if (local_40 != 0) {
      return nTest_local;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int zero_overhead_test(int K, int nTest, float loss)
{
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) != 0) { \
			fprintf(stderr, "Error:%s:%d:  %s failed: %d\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			if (config) \
				free(config); \
			return -1; \
		} \
	} while(0)

	int nFail = 0;
	for (int i = 0; i < nTest; ++i) {
		uint32_t ESIs[K];
		if (loss == 1) {
			get_random_esis(K, ESIs);
		} else {
			get_esis_after_loss(K, ESIs, loss);
		}

		/* Create the program */
		RqInterProgram* program = NULL;
		int err = getProgram(K, K, ESIs, &program);
		switch (err) {
		case 0:						break;
		case RQ_ERR_INSUFF_IDS:	++nFail;	break;
		default:
			return -1;
		};

		if (i % 1000 == 0) {
			printf("   Completed test %d, nFail=%d\n", i, nFail);
			fflush(stdout);
		}

		free(program);
	}

#undef RUN_NOFAIL
	return nFail;
}